

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O1

optional<kernel::CCoinsStats> * __thiscall
CoinStatsIndex::LookUpStats
          (optional<kernel::CCoinsStats> *__return_storage_ptr__,CoinStatsIndex *this,
          CBlockIndex *block_index)

{
  uint256 *puVar1;
  bool bVar2;
  long in_FS_OFFSET;
  DBVal entry;
  BlockRef local_1b8;
  DBVal local_188;
  CCoinsStats local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = block_index->phashBlock;
  if (puVar1 != (uint256 *)0x0) {
    local_188.muhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    local_188.muhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_188.muhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_188.muhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    kernel::CCoinsStats::CCoinsStats(&local_100,block_index->nHeight,&local_188.muhash);
    local_100.index_used = true;
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    puVar1 = block_index->phashBlock;
    if (puVar1 != (uint256 *)0x0) {
      local_1b8.hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      local_1b8.hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_1b8.hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_1b8.hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      local_1b8.height = block_index->nHeight;
      bVar2 = LookUpOne(&((this->m_db)._M_t.
                          super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                          .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                         super_CDBWrapper,&local_1b8,&local_188);
      if (bVar2) {
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x10] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x10];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x11] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x11];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x12] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x12];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x13] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x13];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x14] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x14];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x15] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x15];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x16] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x16];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x17] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x17];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x18] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x18];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x19] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x19];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1a] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1b] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1c] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1d] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1e] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1f] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[1] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[1];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[2] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[2];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[3] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[3];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[4] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[4];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[5] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[5];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[6] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[6];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[7] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[7];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[8] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[8];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[9] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[9];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[10] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[10];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xb] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xb];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xc] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xc];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xd] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xd];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xe] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xe];
        local_100.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xf] =
             local_188.muhash.super_base_blob<256U>.m_data._M_elems[0xf];
        local_100.nTransactionOutputs = local_188.transaction_output_count;
        local_100.nBogoSize = local_188.bogo_size;
        local_100.total_amount.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload = (_Storage<long,_true>)local_188.total_amount
        ;
        local_100.total_amount.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged = true;
        local_100.total_subsidy = local_188.total_subsidy;
        local_100.total_unspendable_amount = local_188.total_unspendable_amount;
        local_100.total_prevout_spent_amount = local_188.total_prevout_spent_amount;
        local_100.total_new_outputs_ex_coinbase_amount =
             local_188.total_new_outputs_ex_coinbase_amount;
        local_100.total_coinbase_amount = local_188.total_coinbase_amount;
        local_100.total_unspendables_genesis_block = local_188.total_unspendables_genesis_block;
        local_100.total_unspendables_bip30 = local_188.total_unspendables_bip30;
        local_100.total_unspendables_scripts = local_188.total_unspendables_scripts;
        local_100.total_unspendables_unclaimed_rewards =
             local_188.total_unspendables_unclaimed_rewards;
        memcpy(__return_storage_ptr__,&local_100,0xd0);
      }
      (__return_storage_ptr__->super__Optional_base<kernel::CCoinsStats,_true,_true>)._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_engaged = bVar2;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

std::optional<CCoinsStats> CoinStatsIndex::LookUpStats(const CBlockIndex& block_index) const
{
    CCoinsStats stats{block_index.nHeight, block_index.GetBlockHash()};
    stats.index_used = true;

    DBVal entry;
    if (!LookUpOne(*m_db, {block_index.GetBlockHash(), block_index.nHeight}, entry)) {
        return std::nullopt;
    }

    stats.hashSerialized = entry.muhash;
    stats.nTransactionOutputs = entry.transaction_output_count;
    stats.nBogoSize = entry.bogo_size;
    stats.total_amount = entry.total_amount;
    stats.total_subsidy = entry.total_subsidy;
    stats.total_unspendable_amount = entry.total_unspendable_amount;
    stats.total_prevout_spent_amount = entry.total_prevout_spent_amount;
    stats.total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
    stats.total_coinbase_amount = entry.total_coinbase_amount;
    stats.total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
    stats.total_unspendables_bip30 = entry.total_unspendables_bip30;
    stats.total_unspendables_scripts = entry.total_unspendables_scripts;
    stats.total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;

    return stats;
}